

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::MessageGenerator
          (MessageGenerator *this,string *file_description_name,Descriptor *descriptor,
          GenerationOptions *generation_options)

{
  SubstitutionMap *this_00;
  pointer pcVar1;
  pointer puVar2;
  undefined8 uVar3;
  OneofDescriptor *descriptor_00;
  OneofGenerator *this_01;
  uint uVar4;
  Descriptor *descriptor_01;
  pointer *__ptr;
  int iVar5;
  int index_base;
  Descriptor *this_02;
  unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
  *generator;
  pointer puVar6;
  string_view str;
  string_view str_00;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  *__range3;
  LogMessage local_58;
  FieldGeneratorMap *local_48;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>>>>
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->file_description_name_).field_2;
  (this->file_description_name_)._M_dataplus._M_p = (pointer)local_38;
  pcVar1 = (file_description_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + file_description_name->_M_string_length);
  this->descriptor_ = descriptor;
  this->generation_options_ = generation_options;
  local_48 = &this->field_generators_;
  FieldGeneratorMap::FieldGeneratorMap(local_48,descriptor,generation_options);
  ClassName_abi_cxx11_(&this->class_name_,(objectivec *)this->descriptor_,descriptor_01);
  GetOptionalDeprecatedAttribute<google::protobuf::Descriptor>
            (&this->deprecated_attribute_,descriptor,descriptor->file_);
  local_40 = (vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>>>>
              *)&this->oneof_generators_;
  (this->oneof_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->oneof_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<const_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->oneof_generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<const_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<const_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((descriptor->options_->field_0)._impl_.map_entry_ == true) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/message.cc"
               ,0xce,"!descriptor->options().map_entry()");
    str._M_str = "error: MessageGenerator create of a map<>!";
    str._M_len = 0x2a;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_58,str);
  }
  else {
    if (((descriptor->options_->field_0)._impl_.message_set_wire_format_ != true) ||
       (descriptor->field_count_ == 0)) {
      this_02 = this->descriptor_;
      if (0 < this_02->real_oneof_decl_count_) {
        iVar5 = 0;
        do {
          descriptor_00 = Descriptor::real_oneof_decl(this_02,iVar5);
          this_01 = (OneofGenerator *)operator_new(0x48);
          OneofGenerator::OneofGenerator(this_01,descriptor_00,generation_options);
          local_58._0_8_ = this_01;
          std::
          vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>>>>
          ::
          emplace_back<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>>>
                    (local_40,(unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                               *)&local_58);
          uVar3 = local_58._0_8_;
          if ((OneofGenerator *)local_58._0_8_ != (OneofGenerator *)0x0) {
            this_00 = (SubstitutionMap *)(local_58._0_8_ + 0x10);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                             *)&((SubstitutionMap *)(local_58._0_8_ + 0x10))->subs_map_);
            std::
            vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
            ::~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                       *)this_00);
            operator_delete((void *)uVar3,0x48);
          }
          iVar5 = iVar5 + 1;
          this_02 = this->descriptor_;
        } while (iVar5 < this_02->real_oneof_decl_count_);
      }
      iVar5 = FieldGeneratorMap::CalculateHasBits(local_48);
      uVar4 = iVar5 + 0x1fU;
      if ((int)(iVar5 + 0x1fU) < 0) {
        uVar4 = iVar5 + 0x3eU;
      }
      index_base = 1;
      if (0x3e < iVar5 + 0x3eU) {
        index_base = (int)uVar4 >> 5;
      }
      puVar2 = (this->oneof_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar6 = (this->oneof_generators_).
                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1
          ) {
        OneofGenerator::SetOneofIndexBase
                  ((puVar6->_M_t).
                   super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_false>
                   ._M_head_impl,index_base);
      }
      FieldGeneratorMap::SetOneofIndexBase(local_48,index_base);
      this->sizeof_has_storage_ =
           index_base +
           (int)((ulong)((long)(this->oneof_generators_).
                               super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->oneof_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/message.cc"
               ,0xd1,
               "!descriptor->options().message_set_wire_format() || descriptor->field_count() == 0")
    ;
    str_00._M_str = "error: MessageGenerator message_set_wire_format should never have fields!";
    str_00._M_len = 0x49;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_58,str_00);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_58);
}

Assistant:

MessageGenerator::MessageGenerator(const std::string& file_description_name,
                                   const Descriptor* descriptor,
                                   const GenerationOptions& generation_options)
    : file_description_name_(file_description_name),
      descriptor_(descriptor),
      generation_options_(generation_options),
      field_generators_(descriptor, generation_options),
      class_name_(ClassName(descriptor_)),
      deprecated_attribute_(
          GetOptionalDeprecatedAttribute(descriptor, descriptor->file())) {
  ABSL_CHECK(!descriptor->options().map_entry())
      << "error: MessageGenerator create of a map<>!";
  ABSL_CHECK(!descriptor->options().message_set_wire_format() ||
             descriptor->field_count() == 0)
      << "error: MessageGenerator message_set_wire_format should never have "
         "fields!";
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
    oneof_generators_.push_back(std::make_unique<OneofGenerator>(
        descriptor_->real_oneof_decl(i), generation_options));
  }

  // Assign has bits:
  // 1. FieldGeneratorMap::CalculateHasBits() loops through the fields seeing
  //    who needs has bits and assigning them.
  // 2. FieldGenerator::SetOneofIndexBase() overrides has_bit with a negative
  //    index that groups all the elements in the oneof.
  int num_has_bits = field_generators_.CalculateHasBits();
  int sizeof_has_storage = (num_has_bits + 31) / 32;
  if (sizeof_has_storage == 0) {
    // In the case where no field needs has bits, don't let the _has_storage_
    // end up as zero length (zero length arrays are sort of a grey area
    // since it has to be at the start of the struct). This also ensures a
    // field with only oneofs keeps the required negative indices they need.
    sizeof_has_storage = 1;
  }
  // Tell all the fields the oneof base.
  for (const auto& generator : oneof_generators_) {
    generator->SetOneofIndexBase(sizeof_has_storage);
  }
  field_generators_.SetOneofIndexBase(sizeof_has_storage);
  // sizeof_has_storage needs enough bits for the single fields that aren't in
  // any oneof, and then one int32 for each oneof (to store the field number).
  sizeof_has_storage += oneof_generators_.size();

  sizeof_has_storage_ = sizeof_has_storage;
}